

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSendStringAt
               (HelicsEndpoint endpoint,char *message,HelicsTime time,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  Time sendTime;
  data_view local_40;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    this = pEVar1->endPtr;
    local_40.dblock._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    local_40.dblock._M_str = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (message != (char *)0x0) {
      local_40.dblock._M_len = strlen(message);
      local_40.dblock._M_str = message;
    }
    local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sendTime.internalTimeCode = count_time<9,_long>::convert(time);
    helics::Endpoint::sendAt(this,&local_40,sendTime);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void helicsEndpointSendStringAt(HelicsEndpoint endpoint, const char* message, HelicsTime time, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendAt(AS_STRING_VIEW(message), time);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}